

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Am_Object_Advanced __thiscall
Am_Object_Advanced::Get_Slot_Locale(Am_Object_Advanced *this,Am_Slot_Key key)

{
  uint *puVar1;
  Am_Slot_Data *pAVar2;
  Am_Slot_Key in_DX;
  undefined6 in_register_00000032;
  Am_Object_Data *in_data;
  
  if (*(Am_Object_Data **)CONCAT62(in_register_00000032,key) != (Am_Object_Data *)0x0) {
    pAVar2 = Am_Object_Data::find_slot(*(Am_Object_Data **)CONCAT62(in_register_00000032,key),in_DX)
    ;
    if ((pAVar2 == (Am_Slot_Data *)0x0) ||
       (in_data = pAVar2->context, in_data == (Am_Object_Data *)0x0)) {
      in_data = (Am_Object_Data *)0x0;
    }
    else {
      puVar1 = &(in_data->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 + 1;
    }
    Am_Object_Advanced(this,in_data);
    return (Am_Object_Advanced)(Am_Object)this;
  }
  Am_Error("** Get_Slot_Locale called on a (0L) object.");
}

Assistant:

Am_Object_Advanced
Am_Object_Advanced::Get_Slot_Locale(Am_Slot_Key key) const
{
  if (!data)
    Am_Error("** Get_Slot_Locale called on a (0L) object.");
  Am_Slot_Data *slot = data->find_slot(key);
  if (slot && slot->context) {
    slot->context->Note_Reference();
    return slot->context;
  } else
    return Am_Object_Advanced(nullptr);
}